

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::property::property(property *this,input_buffer *structs,input_buffer *strings)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint8_t byte;
  uint32_t length;
  uint32_t name_offset;
  input_buffer name_buffer;
  string local_b0;
  property_value v;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  (this->labels)._M_h._M_buckets = &(this->labels)._M_h._M_single_bucket;
  (this->labels)._M_h._M_bucket_count = 1;
  (this->labels)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labels)._M_h._M_element_count = 0;
  (this->labels)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->labels)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->labels)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = input_buffer::consume_binary<unsigned_int>(structs,&length);
  if (bVar2) {
    bVar2 = input_buffer::consume_binary<unsigned_int>(structs,&name_offset);
    this->valid = bVar2;
    if (bVar2) {
      input_buffer::buffer_from_offset(&name_buffer,strings,name_offset,0);
      if (name_buffer.size <= name_buffer.cursor) {
        fprintf(_stderr,"Property name offset %u is past the end of the strings table\n",
                (ulong)name_offset);
        this->valid = false;
        return;
      }
      input_buffer::parse_to_abi_cxx11_(&v.label,&name_buffer,'\0');
      std::__cxx11::string::operator=((string *)this,(string *)&v);
      std::__cxx11::string::~string((string *)&v);
      if (length == 0) {
        return;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      property_value::property_value(&v,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      uVar3 = 0;
      do {
        if (length <= uVar3) {
          std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
          push_back(&this->values,&v);
LAB_0012c898:
          property_value::~property_value(&v);
          return;
        }
        iVar1 = structs->cursor;
        if (structs->size <= iVar1) {
          this->valid = false;
          fwrite("Failed to read property value\n",0x1e,1,_stderr);
          goto LAB_0012c898;
        }
        structs->cursor = iVar1 + 1;
        byte = structs->buffer[iVar1];
        this->valid = true;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&v.byte_data,&byte);
        uVar3 = uVar3 + 1;
      } while( true );
    }
  }
  else {
    this->valid = false;
  }
  fwrite("Failed to read property\n",0x18,1,_stderr);
  return;
}

Assistant:

property::property(input_buffer &structs, input_buffer &strings)
{
	uint32_t name_offset;
	uint32_t length;
	valid = structs.consume_binary(length) &&
		structs.consume_binary(name_offset);
	if (!valid)
	{
		fprintf(stderr, "Failed to read property\n");
		return;
	}
	// Find the name
	input_buffer name_buffer = strings.buffer_from_offset(name_offset);
	if (name_buffer.finished())
	{
		fprintf(stderr, "Property name offset %" PRIu32
			" is past the end of the strings table\n",
			name_offset);
		valid = false;
		return;
	}
	key = name_buffer.parse_to(0);

	// If we're empty, do not push anything as value.
	if (!length)
		return;

	// Read the value
	uint8_t byte;
	property_value v;
	for (uint32_t i=0 ; i<length ; i++)
	{
		if (!(valid = structs.consume_binary(byte)))
		{
			fprintf(stderr, "Failed to read property value\n");
			return;
		}
		v.byte_data.push_back(byte);
	}
	values.push_back(v);
}